

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfswindow.cpp
# Opt level: O2

void __thiscall QEglFSWindow::requestActivateWindow(QEglFSWindow *this)

{
  int iVar1;
  QOpenGLCompositorWindow *pQVar2;
  QWindow *pQVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined8 local_30;
  int local_28;
  int local_24;
  QRegion local_20 [8];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformWindow::window();
  iVar1 = QWindow::type();
  if (iVar1 != 0x11) {
    pQVar2 = (QOpenGLCompositorWindow *)QOpenGLCompositor::instance();
    QOpenGLCompositor::moveToTop(pQVar2);
  }
  pQVar3 = (QWindow *)QPlatformWindow::window();
  QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
            (pQVar3,ActiveWindowFocusReason);
  auVar4 = QWindow::geometry();
  local_28 = auVar4._8_4_ - auVar4._0_4_;
  local_30 = 0;
  local_24 = auVar4._12_4_ - auVar4._4_4_;
  QRegion::QRegion(local_20,&local_30,0);
  QWindowSystemInterface::handleExposeEvent<QWindowSystemInterface::DefaultDelivery>
            (pQVar3,local_20);
  QRegion::~QRegion(local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSWindow::requestActivateWindow()
{
#ifndef QT_NO_OPENGL
    if (window()->type() != Qt::Desktop)
        QOpenGLCompositor::instance()->moveToTop(this);
#endif
    QWindow *wnd = window();
    QWindowSystemInterface::handleFocusWindowChanged(wnd, Qt::ActiveWindowFocusReason);
    QWindowSystemInterface::handleExposeEvent(wnd, QRect(QPoint(0, 0), wnd->geometry().size()));
}